

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O1

void __thiscall xmrig::OclBaseRunner::build(OclBaseRunner *this)

{
  cl_program p_Var1;
  runtime_error *this_00;
  char *pcVar2;
  
  p_Var1 = OclCache::build(&this->super_IOclRunner);
  this->m_program = p_Var1;
  if (p_Var1 != (cl_program)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = OclError::toString(-0x2c);
  std::runtime_error::runtime_error(this_00,pcVar2);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void xmrig::OclBaseRunner::build()
{
    m_program = OclCache::build(this);

    if (m_program == nullptr) {
        throw std::runtime_error(OclError::toString(CL_INVALID_PROGRAM));
    }
}